

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O2

void __thiscall
QFutureInterfaceBase::setContinuation
          (QFutureInterfaceBase *this,function<void_(const_QFutureInterfaceBase_&)> func,
          void *continuationFutureData,ContinuationType type)

{
  QFutureInterfaceBasePrivate *pQVar1;
  QFutureInterfaceBasePrivate *pQVar2;
  ContinuationType in_CL;
  undefined7 in_register_00000011;
  QBasicMutex *this_00;
  long in_FS_OFFSET;
  QMessageLogger local_60;
  undefined1 local_40 [16];
  long local_30;
  
  pQVar1 = (QFutureInterfaceBasePrivate *)CONCAT71(in_register_00000011,type);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = &this->d->continuationMutex;
  local_40._0_8_ = this_00;
  QBasicMutex::lock(this_00);
  local_40[8] = true;
  pQVar2 = this->d;
  if (((pQVar2->state).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i & 4U) != 0) {
    pQVar2->continuationExecuted = true;
    QBasicMutex::unlock(this_00);
    local_40[8] = false;
    std::function<void_(const_QFutureInterfaceBase_&)>::operator()
              ((function<void_(const_QFutureInterfaceBase_&)> *)continuationFutureData,this);
    QBasicMutex::lock((QBasicMutex *)local_40._0_8_);
    pQVar2 = this->d;
  }
  local_40[8] = true;
  if ((pQVar2->continuationState)._M_i != Cleaned) {
    pQVar2 = this->d;
    if ((pQVar2->continuation).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_60.context.version = 2;
      local_60.context.function._4_4_ = 0;
      local_60.context._4_8_ = 0;
      local_60.context._12_8_ = 0;
      local_60.context.category = "default";
      QMessageLogger::warning
                (&local_60,
                 "Adding a continuation to a future which already has a continuation. The existing continuation is overwritten."
                );
      pQVar2 = this->d;
      if (pQVar2->continuationData != (QFutureInterfaceBasePrivate *)0x0) {
        pQVar2->continuationData->nonConcludedParent = (QFutureInterfaceBasePrivate *)0x0;
      }
    }
    std::function<void_(const_QFutureInterfaceBase_&)>::operator=
              (&pQVar2->continuation,
               (function<void_(const_QFutureInterfaceBase_&)> *)continuationFutureData);
    pQVar2 = this->d;
    if (pQVar1 != (QFutureInterfaceBasePrivate *)0x0) {
      pQVar1->continuationType = in_CL;
      pQVar1->nonConcludedParent = pQVar2;
    }
    pQVar2->continuationData = pQVar1;
  }
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::setContinuation(std::function<void (const QFutureInterfaceBase &)> func,
                                           void *continuationFutureData, ContinuationType type)
{
    auto *futureData = static_cast<QFutureInterfaceBasePrivate *>(continuationFutureData);

    QMutexLocker lock(&d->continuationMutex);

    // If the state is ready, run continuation immediately,
    // otherwise save it for later.
    if (isFinished()) {
        d->continuationExecuted = true;
        lock.unlock();
        func(*this);
        lock.relock();
    }
    // Unless the continuation has been cleaned earlier, we have to
    // store the move-only continuation, to guarantee that the associated
    // future's data stays alive.
    if (d->continuationState != QFutureInterfaceBasePrivate::Cleaned) {
        if (d->continuation) {
            qWarning("Adding a continuation to a future which already has a continuation. "
                     "The existing continuation is overwritten.");
            if (d->continuationData)
                d->continuationData->nonConcludedParent = nullptr;
        }
        d->continuation = std::move(func);
        if (futureData) {
            futureData->continuationType = type;
            futureData->nonConcludedParent = d;
        }
        d->continuationData = futureData;
        Q_ASSERT_X(!futureData || futureData->continuationType != ContinuationType::Unknown,
                   "setContinuation", "Make sure to provide a correct continuation type!");
    }
}